

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

int __thiscall FStateLabelStorage::AddNames(FStateLabelStorage *this,TArray<FName,_FName> *names)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uchar *__dest;
  FName *pFVar5;
  int pos;
  int siz;
  TArray<FName,_FName> *names_local;
  FStateLabelStorage *this_local;
  
  uVar1 = TArray<FName,_FName>::Size(names);
  if ((int)uVar1 < 2) {
    pFVar5 = TArray<FName,_FName>::operator[](names,0);
    iVar3 = FName::GetIndex(pFVar5);
    this_local._4_4_ = iVar3 + 0x10000000;
  }
  else {
    uVar2 = TArray<FName,_FName>::Size(names);
    uVar2 = TArray<unsigned_char,_unsigned_char>::Reserve(&this->Storage,uVar2 * 4 + 4);
    puVar4 = (uint *)TArray<unsigned_char,_unsigned_char>::operator[]
                               (&this->Storage,(long)(int)uVar2);
    *puVar4 = uVar1;
    __dest = TArray<unsigned_char,_unsigned_char>::operator[](&this->Storage,(long)(int)uVar2 + 4);
    pFVar5 = TArray<FName,_FName>::operator[](names,0);
    uVar1 = TArray<FName,_FName>::Size(names);
    memcpy(__dest,pFVar5,(ulong)uVar1 << 2);
    this_local._4_4_ = (int)uVar2 / 4 + 1;
  }
  return this_local._4_4_;
}

Assistant:

int AddNames(TArray<FName> &names)
	{
		int siz = names.Size();
		if (siz > 1)
		{
			int pos = Storage.Reserve(sizeof(int) + sizeof(FName) * names.Size());
			memcpy(&Storage[pos], &siz, sizeof(int));
			memcpy(&Storage[pos + sizeof(int)], &names[0], sizeof(FName) * names.Size());
			return pos / 4 + 1;
		}
		else
		{
			// don't store single name states in the array.
			return names[0].GetIndex() + 0x10000000;
		}
	}